

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O2

matrix<unsigned_int,_521UL> *
trng::operator*(matrix<unsigned_int,_521UL> *__return_storage_ptr__,matrix<unsigned_int,_521UL> *a,
               matrix<unsigned_int,_521UL> *b)

{
  pointer puVar1;
  pointer puVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  size_type k0;
  ulong uVar11;
  size_type k_end;
  ulong uVar12;
  ulong uVar13;
  size_type i_1;
  long lVar14;
  long local_58;
  long local_48;
  
  matrix<unsigned_int,_521UL>::matrix(__return_storage_ptr__);
  local_58 = 0;
  for (uVar13 = 0; uVar13 < 0x209; uVar13 = uVar13 + 0x20) {
    uVar7 = 0x1e9;
    if (uVar13 < 0x1e9) {
      uVar7 = uVar13;
    }
    lVar4 = local_58;
    for (lVar8 = 0; lVar8 != 0x209; lVar8 = lVar8 + 1) {
      puVar2 = (__return_storage_ptr__->data).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = 0; uVar13 + lVar10 < uVar7 + 0x20; lVar10 = lVar10 + 1) {
        *(undefined4 *)((long)puVar2 + lVar10 * 4 + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x824;
    }
    lVar4 = 0;
    local_48 = local_58;
    for (uVar11 = 0; uVar11 < 0x209; uVar11 = uVar11 + 0x20) {
      uVar12 = 0x1e9;
      if (uVar11 < 0x1e9) {
        uVar12 = uVar11;
      }
      lVar8 = lVar4;
      for (lVar10 = 0; lVar10 != 0x209; lVar10 = lVar10 + 1) {
        puVar2 = (__return_storage_ptr__->data).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = local_48;
        for (uVar5 = uVar13; uVar5 < uVar7 + 0x20; uVar5 = uVar5 + 1) {
          piVar3 = (int *)((long)(b->data).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar6);
          iVar9 = 0;
          for (lVar14 = 0; uVar11 + lVar14 < uVar12 + 0x20; lVar14 = lVar14 + 1) {
            iVar9 = iVar9 + *piVar3 * *(int *)((long)(a->data).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                              lVar14 * 4 + lVar8);
            piVar3 = piVar3 + 0x209;
          }
          puVar1 = puVar2 + lVar10 * 0x209 + uVar5;
          *puVar1 = *puVar1 + iVar9;
          lVar6 = lVar6 + 4;
        }
        lVar8 = lVar8 + 0x824;
      }
      local_48 = local_48 + 0x10480;
      lVar4 = lVar4 + 0x80;
    }
    local_58 = local_58 + 0x80;
  }
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }